

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O3

HashUtil * __thiscall cfd::core::HashUtil::operator<<(HashUtil *this,string *str)

{
  ByteData local_30;
  
  ByteData::ByteData(&local_30,(uint8_t *)(str->_M_dataplus)._M_p,(uint32_t)str->_M_string_length);
  ByteData::Push(&this->buffer_,&local_30);
  if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return this;
}

Assistant:

HashUtil &HashUtil::operator<<(const std::string &str) {
  buffer_.Push(ByteData(
      reinterpret_cast<const uint8_t *>(str.data()),
      static_cast<uint32_t>(str.size())));
  return *this;
}